

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkObj.c
# Opt level: O0

void Nwk_ManDeleteNode_rec(Nwk_Obj_t *pObj)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Nwk_Obj_t *p;
  int local_1c;
  int i;
  Vec_Ptr_t *vNodes;
  Nwk_Obj_t *pObj_local;
  
  iVar1 = Nwk_ObjIsCi(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Nwk_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkObj.c"
                  ,0xbb,"void Nwk_ManDeleteNode_rec(Nwk_Obj_t *)");
  }
  iVar1 = Nwk_ObjFanoutNum(pObj);
  if (iVar1 != 0) {
    __assert_fail("Nwk_ObjFanoutNum(pObj) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkObj.c"
                  ,0xbc,"void Nwk_ManDeleteNode_rec(Nwk_Obj_t *)");
  }
  vNodes_00 = Vec_PtrAlloc(100);
  Nwk_ObjCollectFanins(pObj,vNodes_00);
  Nwk_ManDeleteNode(pObj);
  for (local_1c = 0; iVar1 = Vec_PtrSize(vNodes_00), local_1c < iVar1; local_1c = local_1c + 1) {
    p = (Nwk_Obj_t *)Vec_PtrEntry(vNodes_00,local_1c);
    iVar1 = Nwk_ObjIsNode(p);
    if ((iVar1 != 0) && (iVar1 = Nwk_ObjFanoutNum(p), iVar1 == 0)) {
      Nwk_ManDeleteNode_rec(p);
    }
  }
  Vec_PtrFree(vNodes_00);
  return;
}

Assistant:

void Nwk_ManDeleteNode_rec( Nwk_Obj_t * pObj )
{
    Vec_Ptr_t * vNodes;
    int i;
    assert( !Nwk_ObjIsCi(pObj) );
    assert( Nwk_ObjFanoutNum(pObj) == 0 );
    vNodes = Vec_PtrAlloc( 100 );
    Nwk_ObjCollectFanins( pObj, vNodes );
    Nwk_ManDeleteNode( pObj );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pObj, i )
        if ( Nwk_ObjIsNode(pObj) && Nwk_ObjFanoutNum(pObj) == 0 )
            Nwk_ManDeleteNode_rec( pObj );
    Vec_PtrFree( vNodes );
}